

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> __thiscall
ft::map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::BSTinsert
          (map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,node *curr,
          value_type *val)

{
  value_type vVar1;
  value_type vVar2;
  value_type *in_RCX;
  undefined8 extraout_RDX;
  undefined1 uVar3;
  value_type vVar4;
  value_type *pvVar5;
  pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> pVar6;
  
  vVar1.first = curr->colour;
  vVar1.second = *(second_type *)&curr->field_0xc;
  curr->right->parent->left = (treeNode<ft::pair<const_int,_int>_> *)vVar1;
  curr->parent->parent->right = (treeNode<ft::pair<const_int,_int>_> *)vVar1;
  vVar4 = vVar1;
  do {
    if ((value_type)val == vVar1) {
      val = (value_type *)operator_new(0x28);
      vVar1 = *in_RCX;
      *val = vVar1;
      ((value_type *)((long)val + 8))->first = 0;
      ((value_type *)((long)val + 0x10))->first = 0;
      ((value_type *)((long)val + 0x10))->second = 0;
      ((value_type *)((long)val + 0x18))->first = 0;
      ((value_type *)((long)val + 0x18))->second = 0;
      *(value_type *)((long)val + 0x20) = vVar4;
      vVar2.first = curr->colour;
      vVar2.second = *(second_type *)&curr->field_0xc;
      if (vVar4 == vVar2) {
        pvVar5 = (value_type *)&curr->left;
      }
      else if (vVar1.first < *(int *)vVar4) {
        pvVar5 = (value_type *)((long)vVar4 + 0x10);
      }
      else {
        pvVar5 = (value_type *)((long)vVar4 + 0x18);
      }
      *pvVar5 = (value_type)val;
      *(value_type *)((long)val + 0x10) = vVar2;
      *(value_type *)((long)val + 0x18) = vVar2;
      uVar3 = 1;
LAB_0010a7f9:
      treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      ::attach((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                *)curr);
      (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
      super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      ._vptr_treeBase = (_func_int **)val;
      *(undefined1 *)
       &(this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
        super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
        .m_tree.NIL = uVar3;
      pVar6._8_8_ = extraout_RDX;
      pVar6.first = (first_type)this;
      return pVar6;
    }
    if (val->first == in_RCX->first) {
      uVar3 = 0;
      goto LAB_0010a7f9;
    }
    vVar4 = (value_type)val;
    val = (value_type *)
          *(value_type *)((int *)((long)val + 0x10) + (ulong)(val->first <= in_RCX->first) * 2);
  } while( true );
}

Assistant:

ft::pair<node*, bool>	BSTinsert(node* curr, value_type const & val) {
		this->detach();

		node*	p = this->NIL();

		while (curr != this->NIL()) {
			p = curr;
			if (this->equal(val, curr->value)) {
				this->attach();
				return ft::make_pair(curr, false);
			}
			else if (this->value_comp()(val, curr->value))
				curr = curr->left;
			else
				curr = curr->right;
		}

		node*	newNode = this->m_alloc.allocate(1);
		this->m_alloc.construct(newNode, val);

		newNode->parent = p;

		if (p == this->NIL())
			this->m_tree.m_root = newNode;
		else if (this->value_comp()(newNode->value, p->value))
			p->left = newNode;
		else
			p->right = newNode;

		newNode->left = this->NIL();
		newNode->right = this->NIL();

		this->attach();

		return ft::make_pair(newNode, true);
	}